

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall FDecalLib::AddDecal(FDecalLib *this,FDecalBase *decal)

{
  WORD num;
  PClass **ppPVar1;
  NameEntry *pNVar2;
  uint uVar3;
  ulong uVar4;
  FDecalBase *pFVar5;
  ulong uVar6;
  FDecalLib *pFVar7;
  FDecalBase *from;
  
  pFVar5 = this->Root;
  num = decal->SpawnID;
  decal->SpawnID = 0;
  pNVar2 = FName::NameData.NameArray;
  pFVar7 = this;
  from = pFVar5;
  while (from != (FDecalBase *)0x0) {
    uVar3 = strcasecmp(pNVar2[(decal->Name).Index].Text,pNVar2[(from->Name).Index].Text);
    if (uVar3 == 0) goto LAB_003748ce;
    pFVar7 = (FDecalLib *)(&from->Left + (~uVar3 >> 0x1f));
    from = pFVar7->Root;
  }
  from = (FDecalBase *)0x0;
LAB_003748ce:
  if (from == (FDecalBase *)0x0) {
    decal->SpawnID = 0;
    pFVar7->Root = decal;
    decal->Left = (FDecalBase *)0x0;
    decal->Right = (FDecalBase *)0x0;
  }
  else {
    ReplaceDecalRef(from,decal,pFVar5);
    decal->Left = from->Left;
    decal->Right = from->Right;
    pFVar7->Root = decal;
    uVar4 = (ulong)(from->Users).Count;
    if (uVar4 != 0) {
      ppPVar1 = (from->Users).Array;
      uVar6 = 0;
      do {
        *(FDecalBase **)(ppPVar1[uVar6]->Defaults + 0x478) = decal;
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
    TArray<const_PClass_*,_const_PClass_*>::operator=(&decal->Users,&from->Users);
    (*from->_vptr_FDecalBase[3])(from);
  }
  if (num != 0) {
    pFVar5 = ScanTreeForNum(num,this->Root);
    if (pFVar5 != (FDecalBase *)0x0) {
      pFVar5->SpawnID = 0;
    }
    decal->SpawnID = num;
  }
  return;
}

Assistant:

void FDecalLib::AddDecal (FDecalBase *decal)
{
	FDecalBase *node = Root, **prev = &Root;
	int num = decal->SpawnID;

	decal->SpawnID = 0;

	// Check if this decal already exists.
	while (node != NULL)
	{
		int lexx = stricmp (decal->Name, node->Name);
		if (lexx == 0)
		{
			break;
		}
		else if (lexx < 0)
		{
			prev = &node->Left;
			node = node->Left;
		}
		else
		{
			prev = &node->Right;
			node = node->Right;
		}
	}
	if (node == NULL)
	{ // No, add it.
		decal->SpawnID = 0;
		*prev = decal;
		decal->Left = NULL;
		decal->Right = NULL;
	}
	else
	{ // Yes, replace the old one.
		// If this decal has been used as the lowerdecal for another decal,
		// be sure and update the lowerdecal to use the new decal.
		ReplaceDecalRef(node, decal, Root);

		decal->Left = node->Left;
		decal->Right = node->Right;
		*prev = decal;

		// Fix references to the old decal so that they use the new one instead.
		for (unsigned int i = 0; i < node->Users.Size(); ++i)
		{
			((AActor *)node->Users[i]->Defaults)->DecalGenerator = decal;
		}
		decal->Users = node->Users;
		delete node;
	}
	// If this decal has an ID, make sure no existing decals have the same ID.
	if (num != 0)
	{
		FDecalBase *spawner = ScanTreeForNum (num, Root);
		if (spawner != NULL)
		{
			spawner->SpawnID = 0;
		}
		decal->SpawnID = num;
	}
}